

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAAhermiteMalloc(IDAMem IDA_mem)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long *__ptr;
  long lVar5;
  long in_RDI;
  int allocOK;
  long ii;
  long i;
  IDAhermiteDataMem content;
  IDAdtpntMem *dt_mem;
  IDAadjMem IDAADJ_mem;
  int local_3c;
  long local_38;
  long local_30;
  int local_4;
  
  local_38 = 0;
  local_3c = 1;
  lVar1 = *(long *)(in_RDI + 0x840);
  uVar4 = N_VClone(*(undefined8 *)(in_RDI + 0x2c8));
  *(undefined8 *)(lVar1 + 0x158) = uVar4;
  if (*(long *)(lVar1 + 0x158) == 0) {
    local_4 = 0;
  }
  else {
    uVar4 = N_VClone(*(undefined8 *)(in_RDI + 0x2c8));
    *(undefined8 *)(lVar1 + 0x160) = uVar4;
    if (*(long *)(lVar1 + 0x160) == 0) {
      local_4 = 0;
    }
    else {
      if (*(int *)(lVar1 + 0xb8) != 0) {
        uVar4 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x2c8));
        *(undefined8 *)(lVar1 + 0x168) = uVar4;
        if (*(long *)(lVar1 + 0x168) == 0) {
          N_VDestroy(*(undefined8 *)(lVar1 + 0x158));
          N_VDestroy(*(undefined8 *)(lVar1 + 0x160));
          return 0;
        }
        uVar4 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x2c8));
        *(undefined8 *)(lVar1 + 0x170) = uVar4;
        if (*(long *)(lVar1 + 0x170) == 0) {
          N_VDestroy(*(undefined8 *)(lVar1 + 0x158));
          N_VDestroy(*(undefined8 *)(lVar1 + 0x160));
          N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x168),*(undefined4 *)(in_RDI + 0xa0));
          return 0;
        }
      }
      lVar2 = *(long *)(lVar1 + 0x78);
      for (local_30 = 0; local_30 <= *(long *)(lVar1 + 0x68); local_30 = local_30 + 1) {
        __ptr = (long *)malloc(0x20);
        if (__ptr == (long *)0x0) {
          local_38 = local_30;
          local_3c = 0;
          break;
        }
        lVar5 = N_VClone(*(undefined8 *)(in_RDI + 0x2c8));
        *__ptr = lVar5;
        if (*__ptr == 0) {
          free(__ptr);
          local_38 = local_30;
          local_3c = 0;
          break;
        }
        lVar5 = N_VClone(*(undefined8 *)(in_RDI + 0x2c8));
        __ptr[1] = lVar5;
        if (__ptr[1] == 0) {
          N_VDestroy(*__ptr);
          free(__ptr);
          local_38 = local_30;
          local_3c = 0;
          break;
        }
        if (*(int *)(lVar1 + 0xb8) != 0) {
          lVar5 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x2c8)
                                     );
          __ptr[2] = lVar5;
          if (__ptr[2] == 0) {
            N_VDestroy(*__ptr);
            N_VDestroy(__ptr[1]);
            free(__ptr);
            local_38 = local_30;
            local_3c = 0;
            break;
          }
          lVar5 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x2c8)
                                     );
          __ptr[3] = lVar5;
          if (__ptr[3] == 0) {
            N_VDestroy(*__ptr);
            N_VDestroy(__ptr[1]);
            N_VDestroyVectorArray(__ptr[2],*(undefined4 *)(in_RDI + 0xa0));
            free(__ptr);
            local_38 = local_30;
            local_3c = 0;
            break;
          }
        }
        *(long **)(*(long *)(lVar2 + local_30 * 8) + 8) = __ptr;
      }
      if (local_3c == 0) {
        N_VDestroy(*(undefined8 *)(lVar1 + 0x158));
        N_VDestroy(*(undefined8 *)(lVar1 + 0x160));
        if (*(int *)(lVar1 + 0xb8) != 0) {
          N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x168),*(undefined4 *)(in_RDI + 0xa0));
          N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x170),*(undefined4 *)(in_RDI + 0xa0));
        }
        for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
          puVar3 = *(undefined8 **)(*(long *)(lVar2 + local_30 * 8) + 8);
          N_VDestroy(*puVar3);
          N_VDestroy(puVar3[1]);
          if (*(int *)(lVar1 + 0xb8) != 0) {
            N_VDestroyVectorArray(puVar3[2],*(undefined4 *)(in_RDI + 0xa0));
            N_VDestroyVectorArray(puVar3[3],*(undefined4 *)(in_RDI + 0xa0));
          }
          free(*(void **)(*(long *)(lVar2 + local_30 * 8) + 8));
          *(undefined8 *)(*(long *)(lVar2 + local_30 * 8) + 8) = 0;
        }
      }
      local_4 = local_3c;
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype IDAAhermiteMalloc(IDAMem IDA_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDAhermiteDataMem content;
  long int i, ii = 0;
  sunbooleantype allocOK;

  allocOK = SUNTRUE;

  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Allocate space for the vectors yyTmp and ypTmp. */
  IDAADJ_mem->ia_yyTmp = N_VClone(IDA_mem->ida_tempv1);
  if (IDAADJ_mem->ia_yyTmp == NULL) { return (SUNFALSE); }
  IDAADJ_mem->ia_ypTmp = N_VClone(IDA_mem->ida_tempv1);
  if (IDAADJ_mem->ia_ypTmp == NULL) { return (SUNFALSE); }

  /* Allocate space for sensitivities temporary vectors. */
  if (IDAADJ_mem->ia_storeSensi)
  {
    IDAADJ_mem->ia_yySTmp = N_VCloneVectorArray(IDA_mem->ida_Ns,
                                                IDA_mem->ida_tempv1);
    if (IDAADJ_mem->ia_yySTmp == NULL)
    {
      N_VDestroy(IDAADJ_mem->ia_yyTmp);
      N_VDestroy(IDAADJ_mem->ia_ypTmp);
      return (SUNFALSE);
    }

    IDAADJ_mem->ia_ypSTmp = N_VCloneVectorArray(IDA_mem->ida_Ns,
                                                IDA_mem->ida_tempv1);
    if (IDAADJ_mem->ia_ypSTmp == NULL)
    {
      N_VDestroy(IDAADJ_mem->ia_yyTmp);
      N_VDestroy(IDAADJ_mem->ia_ypTmp);
      N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
      return (SUNFALSE);
    }
  }

  /* Allocate space for the content field of the dt structures */

  dt_mem = IDAADJ_mem->dt_mem;

  for (i = 0; i <= IDAADJ_mem->ia_nsteps; i++)
  {
    content = NULL;
    content = (IDAhermiteDataMem)malloc(sizeof(struct IDAhermiteDataMemRec));
    if (content == NULL)
    {
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->y = N_VClone(IDA_mem->ida_tempv1);
    if (content->y == NULL)
    {
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->yd = N_VClone(IDA_mem->ida_tempv1);
    if (content->yd == NULL)
    {
      N_VDestroy(content->y);
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    if (IDAADJ_mem->ia_storeSensi)
    {
      content->yS = N_VCloneVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_tempv1);
      if (content->yS == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }

      content->ySd = N_VCloneVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_tempv1);
      if (content->ySd == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }
    }

    dt_mem[i]->content = content;
  }

  /* If an error occurred, deallocate and return */

  if (!allocOK)
  {
    N_VDestroy(IDAADJ_mem->ia_yyTmp);
    N_VDestroy(IDAADJ_mem->ia_ypTmp);

    if (IDAADJ_mem->ia_storeSensi)
    {
      N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDAADJ_mem->ia_ypSTmp, IDA_mem->ida_Ns);
    }

    for (i = 0; i < ii; i++)
    {
      content = (IDAhermiteDataMem)(dt_mem[i]->content);
      N_VDestroy(content->y);
      N_VDestroy(content->yd);

      if (IDAADJ_mem->ia_storeSensi)
      {
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        N_VDestroyVectorArray(content->ySd, IDA_mem->ida_Ns);
      }

      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }

  return (allocOK);
}